

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void SetCurrentWindow(ImGuiWindow *window)

{
  int i;
  ImGuiContext *pIVar1;
  ImGuiTable *pIVar2;
  float fVar3;
  
  pIVar1 = GImGui;
  GImGui->CurrentWindow = window;
  if (window == (ImGuiWindow *)0x0) {
    pIVar1->CurrentTable = (ImGuiTable *)0x0;
  }
  else {
    i = (window->DC).CurrentTableIdx;
    if (i == -1) {
      pIVar2 = (ImGuiTable *)0x0;
    }
    else {
      pIVar2 = ImVector<ImGuiTable>::operator[](&(pIVar1->Tables).Buf,i);
    }
    pIVar1->CurrentTable = pIVar2;
    fVar3 = ImGuiWindow::CalcFontSize(window);
    (pIVar1->DrawListSharedData).FontSize = fVar3;
    pIVar1->FontSize = fVar3;
  }
  return;
}

Assistant:

static void SetCurrentWindow(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    g.CurrentWindow = window;
    g.CurrentTable = window && window->DC.CurrentTableIdx != -1 ? g.Tables.GetByIndex(window->DC.CurrentTableIdx) : NULL;
    if (window)
        g.FontSize = g.DrawListSharedData.FontSize = window->CalcFontSize();
}